

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O3

TagSet * __thiscall
Omega_h::get_all_mesh_tags_abi_cxx11_(TagSet *__return_storage_ptr__,Omega_h *this,Mesh *mesh)

{
  long lVar1;
  uint uVar2;
  TagBase *this_00;
  string *__v;
  long lVar3;
  Int j;
  int i;
  ulong uVar4;
  
  lVar3 = 0;
  do {
    lVar1 = (long)&__return_storage_ptr__->_M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_color + lVar3;
    *(undefined4 *)
     ((long)&__return_storage_ptr__->_M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_color + lVar3) = 0;
    *(undefined8 *)
     ((long)&__return_storage_ptr__->_M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent + lVar3) = 0;
    *(long *)((long)&__return_storage_ptr__->_M_elems[0]._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_left + lVar3) = lVar1;
    *(long *)((long)&__return_storage_ptr__->_M_elems[0]._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_right + lVar3) = lVar1;
    *(undefined8 *)
     ((long)&__return_storage_ptr__->_M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_node_count +
     lVar3) = 0;
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0xc0);
  uVar2 = *(uint *)(this + 4);
  if (uVar2 < 4) {
    uVar4 = 0;
    do {
      if (uVar2 < uVar4) {
        return __return_storage_ptr__;
      }
      i = 0;
      while( true ) {
        Mesh::check_dim2((Mesh *)this,(Int)uVar4);
        if ((int)((ulong)(*(long *)(this + uVar4 * 0x18 + 0x30 + 8) -
                         *(long *)(this + uVar4 * 0x18 + 0x30)) >> 4) <= i) break;
        this_00 = Mesh::get_tag((Mesh *)this,(Int)uVar4,i);
        __v = TagBase::name_abi_cxx11_(this_00);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)(__return_storage_ptr__->_M_elems + uVar4),__v);
        i = i + 1;
      }
      uVar4 = uVar4 + 1;
      uVar2 = *(uint *)(this + 4);
    } while (uVar2 < 4);
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

TagSet get_all_mesh_tags(Mesh* mesh) {
  TagSet out;
  for (Int i = 0; i <= mesh->dim(); ++i) {
    for (Int j = 0; j < mesh->ntags(i); ++j) {
      auto tagbase = mesh->get_tag(i, j);
      out[size_t(i)].insert(tagbase->name());
    }
  }
  return out;
}